

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_prepare16_v3
              (sqlite3 *db,void *zSql,int nBytes,uint prepFlags,sqlite3_stmt **ppStmt,void **pzTail)

{
  int iVar1;
  void **in_stack_00000008;
  int rc;
  
  iVar1 = sqlite3Prepare16((sqlite3 *)zSql,(void *)CONCAT44(nBytes,prepFlags),ppStmt._4_4_,
                           (u32)ppStmt,(sqlite3_stmt **)pzTail,in_stack_00000008);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_prepare16_v3(
  sqlite3 *db,              /* Database handle. */
  const void *zSql,         /* UTF-16 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  unsigned int prepFlags,   /* Zero or more SQLITE_PREPARE_* flags */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const void **pzTail       /* OUT: End of parsed string */
){
  int rc;
  rc = sqlite3Prepare16(db,zSql,nBytes,
         SQLITE_PREPARE_SAVESQL|(prepFlags&SQLITE_PREPARE_MASK),
         ppStmt,pzTail);
  assert( rc==SQLITE_OK || ppStmt==0 || *ppStmt==0 );  /* VERIFY: F13021 */
  return rc;
}